

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::i2p_connection::
set_local_endpoint<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (i2p_connection *this,error_code *ec,char *dest,
          _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *h)

{
  bool bVar1;
  _Bind<void_(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *h_local;
  char *dest_local;
  error_code *ec_local;
  i2p_connection *this_local;
  
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  if ((bVar1) || (dest == (char *)0x0)) {
    ::std::__cxx11::string::clear();
  }
  else {
    ::std::__cxx11::string::operator=((string *)&this->m_i2p_local_endpoint,dest);
  }
  ::std::
  _Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
  ::operator()((_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>
                *)h,ec);
  return;
}

Assistant:

void set_local_endpoint(error_code const& ec, char const* dest, Handler h)
	{
		if (!ec && dest != nullptr)
			m_i2p_local_endpoint = dest;
		else
			m_i2p_local_endpoint.clear();

		h(ec);
	}